

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ResultBuilder * __thiscall
Catch::ExpressionLhs<std::basic_string_view<char,std::char_traits<char>>const&>::
captureExpression<(Catch::Internal::Operator)0,std::basic_string_view<char,std::char_traits<char>>>
          (ExpressionLhs<std::basic_string_view<char,std::char_traits<char>>const&> *this,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  bool result;
  ResultBuilder *pRVar1;
  char *__s;
  basic_string_view<char,_std::char_traits<char>_> *value;
  basic_string_view<char,_std::char_traits<char>_> *value_00;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_38;
  basic_string_view<char,_std::char_traits<char>_> *local_18;
  basic_string_view<char,_std::char_traits<char>_> *rhs_local;
  ExpressionLhs<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this_local;
  
  pRVar1 = *(ResultBuilder **)this;
  local_18 = rhs;
  rhs_local = (basic_string_view<char,_std::char_traits<char>_> *)this;
  result = Internal::
           compare<(Catch::Internal::Operator)0,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                     (*(basic_string_view<char,_std::char_traits<char>_> **)(this + 8),rhs);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  toString<std::basic_string_view<char,std::char_traits<char>>>
            (&local_38,*(Catch **)(this + 8),value);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  toString<std::basic_string_view<char,std::char_traits<char>>>
            (&local_68,(Catch *)local_18,value_00);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_68);
  __s = Internal::OperatorTraits<(Catch::Internal::Operator)0>::getName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }